

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

int32_t __thiscall
icu_63::DateTimePatternGenerator::getTopBitNumber(DateTimePatternGenerator *this,int32_t foundMask)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  if (foundMask != 0) {
    uVar3 = 0xffffffff;
    do {
      uVar3 = uVar3 + 1;
      bVar1 = 1 < (uint)foundMask;
      foundMask = foundMask >> 1;
    } while (bVar1);
    uVar2 = 0xf;
    if (uVar3 < 0xf) {
      uVar2 = uVar3;
    }
    return uVar2;
  }
  return 0;
}

Assistant:

int32_t
DateTimePatternGenerator::getTopBitNumber(int32_t foundMask) const {
    if ( foundMask==0 ) {
        return 0;
    }
    int32_t i=0;
    while (foundMask!=0) {
        foundMask >>=1;
        ++i;
    }
    if (i-1 >UDATPG_ZONE_FIELD) {
        return UDATPG_ZONE_FIELD;
    }
    else
        return i-1;
}